

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

bool benchmark::anon_unknown_1::ReadIntFromFile(char *file,long *value)

{
  int __fd;
  ssize_t sVar1;
  long lVar2;
  long temp_value;
  CheckHandler local_438;
  char *local_430;
  char *err;
  char line [1024];
  bool local_19;
  int fd;
  bool ret;
  long *value_local;
  char *file_local;
  
  local_19 = false;
  __fd = open(file,0);
  if (__fd != -1) {
    memset(&err,0,0x400);
    sVar1 = read(__fd,&err,0x3ff);
    if (sVar1 == 0) {
      internal::CheckHandler::CheckHandler
                (&local_438,"read(fd, line, sizeof(line) - 1)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/sysinfo.cc"
                 ,"ReadIntFromFile",0x4f);
      internal::CheckHandler::GetLog(&local_438);
      internal::CheckHandler::~CheckHandler(&local_438);
    }
    internal::GetNullLogInstance();
    lVar2 = strtol((char *)&err,&local_430,10);
    if (((char)err != '\0') && ((*local_430 == '\n' || (*local_430 == '\0')))) {
      *value = lVar2;
      local_19 = true;
    }
    close(__fd);
  }
  return local_19;
}

Assistant:

bool ReadIntFromFile(const char* file, long* value) {
  bool ret = false;
  int fd = open(file, O_RDONLY);
  if (fd != -1) {
    char line[1024];
    char* err;
    memset(line, '\0', sizeof(line));
    CHECK(read(fd, line, sizeof(line) - 1));
    const long temp_value = strtol(line, &err, 10);
    if (line[0] != '\0' && (*err == '\n' || *err == '\0')) {
      *value = temp_value;
      ret = true;
    }
    close(fd);
  }
  return ret;
}